

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O3

vector3 * vector3_rotate_by_quaternion(vector3 *self,quaternion *qT)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  dVar7 = (self->field_0).v[2];
  dVar1 = (self->field_0).v[0];
  dVar2 = (self->field_0).v[1];
  dVar3 = (qT->field_0).q[0];
  dVar4 = (qT->field_0).q[1];
  dVar5 = (qT->field_0).q[2];
  dVar6 = (qT->field_0).q[3];
  dVar8 = -dVar4;
  dVar9 = dVar8 * dVar1 + dVar6 * dVar7 + dVar3 * dVar2;
  dVar11 = (dVar6 * dVar1 + dVar4 * dVar7) - dVar5 * dVar2;
  dVar10 = dVar5 * dVar1 + dVar6 * dVar2 + dVar7 * -dVar3;
  dVar7 = (dVar1 * dVar3 + dVar2 * dVar8) - dVar7 * dVar5;
  (self->field_0).v[0] = dVar4 * dVar9 + -dVar5 * dVar10 + (dVar6 * dVar11 - dVar7 * dVar3);
  (self->field_0).v[1] = -dVar3 * dVar9 + dVar6 * dVar10 + (dVar5 * dVar11 - dVar7 * dVar4);
  (self->field_0).v[2] = dVar9 * dVar6 + (dVar11 * dVar8 - dVar7 * dVar5) + dVar10 * dVar3;
  return self;
}

Assistant:

HYPAPI struct vector3 *vector3_rotate_by_quaternion(struct vector3 *self, const struct quaternion *qT)
{
	struct quaternion qconj;
	struct quaternion q;

	/* make the conjugate */
	quaternion_set(&qconj, qT);
	quaternion_conjugate(&qconj);

	quaternion_set(&q, qT);
	quaternion_multiplyv3(&q, self);
	quaternion_multiply(&q, &qconj);

	self->x = q.x;
	self->y = q.y;
	self->z = q.z;

	return self;
}